

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

Pipeline *
buildEmptyPipelineModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr)

{
  int iVar1;
  ModelDescription *pMVar2;
  Type *pTVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  Pipeline *this;
  int iVar6;
  
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,inTensorAttr->name);
  if (pTVar3->type_ == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  pFVar4 = pTVar3->type_;
  if (pFVar4->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    pAVar5 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar5);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  pAVar5 = (pFVar4->Type_).multiarraytype_;
  pAVar5->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    iVar6 = 0;
    do {
      iVar1 = (pAVar5->shape_).total_size_;
      if ((pAVar5->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar5->shape_,iVar1 + 1);
      }
      iVar1 = (pAVar5->shape_).current_size_;
      (pAVar5->shape_).current_size_ = iVar1 + 1;
      ((pAVar5->shape_).rep_)->elements[iVar1] = 1;
      iVar6 = iVar6 + 1;
    } while (iVar6 < inTensorAttr->dimension);
  }
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,outTensorAttr->name);
  if (pTVar3->type_ == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  pFVar4 = pTVar3->type_;
  if (pFVar4->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    pAVar5 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar5);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  pAVar5 = (pFVar4->Type_).multiarraytype_;
  pAVar5->datatype_ = 0x10020;
  if (0 < outTensorAttr->dimension) {
    iVar6 = 0;
    do {
      iVar1 = (pAVar5->shape_).total_size_;
      if ((pAVar5->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar5->shape_,iVar1 + 1);
      }
      iVar1 = (pAVar5->shape_).current_size_;
      (pAVar5->shape_).current_size_ = iVar1 + 1;
      ((pAVar5->shape_).rep_)->elements[iVar1] = 1;
      iVar6 = iVar6 + 1;
    } while (iVar6 < outTensorAttr->dimension);
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] != 0xca) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0xca;
    this = (Pipeline *)operator_new(0x48);
    CoreML::Specification::Pipeline::Pipeline(this);
    (m->Type_).pipeline_ = this;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return (Pipeline *)(m->Type_).pipelineclassifier_;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}